

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_property.c
# Opt level: O1

int mpt_graph_pointer_typeid(void)

{
  int iVar1;
  
  iVar1 = mpt_graph_pointer_typeid::ptype;
  if (mpt_graph_pointer_typeid::ptype == 0) {
    iVar1 = mpt_type_add(&mpt_graph_pointer_typeid::traits);
    if (0 < iVar1) {
      mpt_graph_pointer_typeid::ptype = iVar1;
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_graph_pointer_typeid(void)
{
	static int ptype = 0;
	int type;
	if (!(type = ptype)) {
		static const MPT_STRUCT(type_traits) traits = MPT_TYPETRAIT_INIT(sizeof(void *));
		if ((type = mpt_type_add(&traits)) > 0) {
			ptype = type;
		}
	}
	return type;
}